

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifold_test.cpp
# Opt level: O3

void __thiscall Manifold_Warp_Test::TestBody(Manifold_Warp_Test *this)

{
  char *pcVar1;
  initializer_list<manifold::Manifold> __l;
  Manifold simplified;
  Manifold shape;
  CrossSection square;
  char *in_stack_ffffffffffffff38;
  AssertHelper in_stack_ffffffffffffff40;
  char local_b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  pointer in_stack_ffffffffffffff58;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a0;
  double in_stack_ffffffffffffff68;
  double in_stack_ffffffffffffff70;
  double in_stack_ffffffffffffff78;
  Manifold local_78 [16];
  undefined8 local_68;
  undefined8 uStack_60;
  code *local_58;
  code *local_50;
  CrossSection local_48 [64];
  
  manifold::CrossSection::Square(0,0x3ff0000000000000,local_48,0);
  manifold::CrossSection::ToPolygons();
  manifold::Manifold::Extrude(0,0,0x3ff0000000000000,0,&stack0xffffffffffffff70,local_b8,10);
  local_68 = 0;
  uStack_60 = 0;
  local_50 = std::
             _Function_handler<void_(linalg::vec<double,_3>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp:365:58)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(linalg::vec<double,_3>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp:365:58)>
             ::_M_manager;
  manifold::Manifold::Warp(local_78,&stack0xffffffffffffff70);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,3);
  }
  manifold::Manifold::~Manifold((Manifold *)&stack0xffffffffffffff70);
  std::
  vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
  ::~vector((vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
             *)local_b8);
  manifold::Manifold::Manifold((Manifold *)&local_a0,local_78);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_a0;
  std::vector<manifold::Manifold,_std::allocator<manifold::Manifold>_>::vector
            ((vector<manifold::Manifold,_std::allocator<manifold::Manifold>_> *)local_b8,__l,
             (allocator_type *)&stack0xffffffffffffff40);
  manifold::Manifold::Compose((vector *)&stack0xffffffffffffff70);
  std::vector<manifold::Manifold,_std::allocator<manifold::Manifold>_>::~vector
            ((vector<manifold::Manifold,_std::allocator<manifold::Manifold>_> *)local_b8);
  manifold::Manifold::~Manifold((Manifold *)&local_a0);
  manifold::Manifold::Volume();
  manifold::Manifold::Volume();
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffff40.data_,in_stack_ffffffffffffff38,
             (char *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68);
  if (local_b8[0] == '\0') {
    testing::Message::Message((Message *)&local_a0);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
               ,0x173,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffff40,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff40);
    if (local_a0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a0._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  manifold::Manifold::SurfaceArea();
  manifold::Manifold::SurfaceArea();
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffff40.data_,in_stack_ffffffffffffff38,
             (char *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68);
  if (local_b8[0] == '\0') {
    testing::Message::Message((Message *)&local_a0);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
               ,0x174,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffff40,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff40);
    if (local_a0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a0._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  manifold::Manifold::Volume();
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffff40.data_,in_stack_ffffffffffffff38,
             (char *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68);
  if (local_b8[0] == '\0') {
    testing::Message::Message((Message *)&local_a0);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
               ,0x175,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffff40,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff40);
    if (local_a0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a0._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  manifold::Manifold::~Manifold((Manifold *)&stack0xffffffffffffff70);
  manifold::Manifold::~Manifold(local_78);
  manifold::CrossSection::~CrossSection(local_48);
  return;
}

Assistant:

TEST(Manifold, Warp) {
  CrossSection square = CrossSection::Square({1, 1});
  Manifold shape =
      Manifold::Extrude(square.ToPolygons(), 2, 10).Warp([](vec3& v) {
        v.x += v.z * v.z;
      });

  Manifold simplified = Manifold::Compose({shape});

  EXPECT_NEAR(shape.Volume(), simplified.Volume(), 0.0001);
  EXPECT_NEAR(shape.SurfaceArea(), simplified.SurfaceArea(), 0.0001);
  EXPECT_NEAR(shape.Volume(), 2, 0.0001);
}